

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::verifyResultImage
          (TestStatus *__return_storage_ptr__,ImageClearingTestInstance *this,string *successMessage
          ,UVec4 *clearCoords)

{
  VkExtent3D VVar1;
  VkExtent3D VVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  TextureLevelPyramid *pTVar6;
  ConstPixelBufferAccess *pCVar7;
  VkExtent3D baseExtent;
  VkExtent3D VVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  uint local_19c;
  uint local_198;
  deUint32 x_2;
  deUint32 y_2;
  deUint32 z;
  deUint32 local_188;
  anon_unknown_0 *local_180;
  deUint32 local_178;
  anon_unknown_0 *local_170;
  deUint32 local_168;
  undefined8 local_164;
  VkExtent3D extent;
  int clearColorNdx;
  deUint32 mipLevel;
  VkClearColorValue *pColorValue;
  string message_2;
  MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> image_2;
  uint local_f4;
  uint local_f0;
  deUint32 x_1;
  deUint32 y_1;
  deUint32 stencilValue;
  string message_1;
  MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> image_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  uint local_7c;
  uint local_78;
  deUint32 x;
  deUint32 y;
  float depthValue;
  string message;
  MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> image;
  bool useClearRange;
  UVec4 *clearCoords_local;
  string *successMessage_local;
  ImageClearingTestInstance *this_local;
  
  tcu::Vector<unsigned_int,_4>::Vector
            ((Vector<unsigned_int,_4> *)
             &image.
              super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
              .m_data.field_0xc);
  bVar4 = tcu::Vector<unsigned_int,_4>::operator!=
                    (clearCoords,
                     (Vector<unsigned_int,_4> *)
                     &image.
                      super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                      .m_data.field_0xc);
  bVar5 = getIsDepthFormat(this,this->m_params->imageFormat);
  if (bVar5) {
    readImage((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
              ((long)&message.field_2 + 8),this,2);
    std::__cxx11::string::string((string *)&y);
    for (local_78 = 0; local_78 < (this->m_params->imageExtent).height; local_78 = local_78 + 1) {
      for (local_7c = 0; local_7c < (this->m_params->imageExtent).width; local_7c = local_7c + 1) {
        if ((!bVar4) || (bVar5 = isInClearRange(clearCoords,local_7c,local_78), bVar5)) {
          x = (deUint32)this->m_params->clearValue[0].depthStencil.depth;
        }
        else {
          x = (deUint32)(this->m_params->initValue).depthStencil.depth;
        }
        pTVar6 = de::details::
                 UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                 ::operator->((UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                               *)((long)&message.field_2 + 8));
        pCVar7 = &tcu::TextureLevelPyramid::getLevel(pTVar6,0)->super_ConstPixelBufferAccess;
        bVar5 = comparePixelToDepthClearValue(pCVar7,local_7c,local_78,(float)x,(string *)&y);
        if (!bVar5) {
          std::operator+(&local_b0,"Depth value mismatch! ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          bVar5 = true;
          goto LAB_008c2f07;
        }
      }
    }
    bVar5 = false;
LAB_008c2f07:
    std::__cxx11::string::~string((string *)&y);
    de::details::MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>::
    ~MovePtr((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
             ((long)&message.field_2 + 8));
    if (bVar5) {
      return __return_storage_ptr__;
    }
  }
  bVar5 = getIsStencilFormat(this,this->m_params->imageFormat);
  if (bVar5) {
    readImage((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
              ((long)&message_1.field_2 + 8),this,4);
    std::__cxx11::string::string((string *)&y_1);
    for (local_f0 = 0; local_f0 < (this->m_params->imageExtent).height; local_f0 = local_f0 + 1) {
      for (local_f4 = 0; local_f4 < (this->m_params->imageExtent).width; local_f4 = local_f4 + 1) {
        if ((!bVar4) || (bVar5 = isInClearRange(clearCoords,local_f4,local_f0), bVar5)) {
          x_1 = this->m_params->clearValue[0].depthStencil.stencil;
        }
        else {
          x_1 = (this->m_params->initValue).depthStencil.stencil;
        }
        pTVar6 = de::details::
                 UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                 ::operator->((UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                               *)((long)&message_1.field_2 + 8));
        pCVar7 = &tcu::TextureLevelPyramid::getLevel(pTVar6,0)->super_ConstPixelBufferAccess;
        bVar5 = comparePixelToStencilClearValue(pCVar7,local_f4,local_f0,x_1,(string *)&y_1);
        if (!bVar5) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &image_2.
                          super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                          .m_data.field_0x8,"Stencil value mismatch! ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y_1);
          tcu::TestStatus::fail
                    (__return_storage_ptr__,
                     (string *)
                     &image_2.
                      super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                      .m_data.field_0x8);
          std::__cxx11::string::~string
                    ((string *)
                     &image_2.
                      super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                      .m_data.field_0x8);
          bVar5 = true;
          goto LAB_008c312c;
        }
      }
    }
    bVar5 = false;
LAB_008c312c:
    std::__cxx11::string::~string((string *)&y_1);
    de::details::MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>::
    ~MovePtr((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
             ((long)&message_1.field_2 + 8));
    if (bVar5) {
      return __return_storage_ptr__;
    }
  }
  bVar5 = ::vk::isDepthStencilFormat(this->m_params->imageFormat);
  VVar2.depth = local_188;
  VVar2.width = y_2;
  VVar2.height = z;
  if (!bVar5) {
    readImage((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
              ((long)&message_2.field_2 + 8),this,1);
    std::__cxx11::string::string((string *)&pColorValue);
    VVar1.depth = extent.width;
    VVar1.width = (uint)local_164;
    VVar1.height = local_164._4_4_;
    VVar8.depth = local_188;
    VVar8.width = y_2;
    VVar8.height = z;
    extent.depth = 0;
    while( true ) {
      extent.width = VVar1.depth;
      local_164 = VVar1._0_8_;
      if (this->m_imageMipLevels <= extent.depth) break;
      extent.height = (deUint32)(this->m_thresholdMipLevel <= extent.depth);
      local_178 = (this->m_params->imageExtent).depth;
      local_180 = *(anon_unknown_0 **)&this->m_params->imageExtent;
      baseExtent.height = 0;
      baseExtent.width = local_178;
      baseExtent.depth = extent.depth;
      local_170 = local_180;
      local_168 = local_178;
      _y_2 = VVar8;
      VVar8 = getMipLevelExtent(local_180,baseExtent,local_178);
      VVar1 = VVar8;
      for (x_2 = 0; extent.width = VVar1.depth, x_2 < extent.width; x_2 = x_2 + 1) {
        for (local_198 = 0; local_164._4_4_ = VVar1.height, local_198 < local_164._4_4_;
            local_198 = local_198 + 1) {
          local_19c = 0;
          while( true ) {
            extent.width = VVar1.depth;
            local_164 = VVar1._0_8_;
            uVar3 = local_164;
            local_164._0_4_ = VVar1.width;
            if ((uint)local_164 <= local_19c) break;
            _y_2 = VVar8;
            if (bVar4) {
              local_164 = uVar3;
              bVar5 = isInClearRange(clearCoords,local_19c,local_198);
              VVar1.depth = extent.width;
              VVar1.width = (uint)local_164;
              VVar1.height = local_164._4_4_;
              if (bVar5) goto LAB_008c3301;
              _clearColorNdx = (VkClearColorValue *)&this->m_params->initValue;
            }
            else {
LAB_008c3301:
              _clearColorNdx =
                   (VkClearColorValue *)(this->m_params->clearValue + (int)extent.height);
            }
            extent.width = VVar1.depth;
            local_164 = VVar1._0_8_;
            pTVar6 = de::details::
                     UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                     ::operator->((UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                                   *)((long)&message_2.field_2 + 8));
            pCVar7 = &tcu::TextureLevelPyramid::getLevel(pTVar6,extent.depth)->
                      super_ConstPixelBufferAccess;
            bVar5 = comparePixelToColorClearValue
                              (pCVar7,local_19c,local_198,x_2,_clearColorNdx,(string *)&pColorValue)
            ;
            VVar1.depth = extent.width;
            VVar1.width = (uint)local_164;
            VVar1.height = local_164._4_4_;
            if (!bVar5) {
              std::operator+(&local_1c0,"Color value mismatch! ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pColorValue);
              tcu::TestStatus::fail(__return_storage_ptr__,&local_1c0);
              std::__cxx11::string::~string((string *)&local_1c0);
              VVar1.depth = extent.width;
              VVar1.width = (uint)local_164;
              VVar1.height = local_164._4_4_;
              bVar4 = true;
              VVar8 = _y_2;
              goto LAB_008c3482;
            }
            local_19c = local_19c + 1;
            VVar8 = _y_2;
          }
        }
      }
      extent.depth = extent.depth + 1;
    }
    bVar4 = false;
LAB_008c3482:
    extent.width = VVar1.depth;
    local_164 = VVar1._0_8_;
    _y_2 = VVar8;
    std::__cxx11::string::~string((string *)&pColorValue);
    de::details::MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>::
    ~MovePtr((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
             ((long)&message_2.field_2 + 8));
    VVar2 = _y_2;
    if (bVar4) {
      return __return_storage_ptr__;
    }
  }
  _y_2 = VVar2;
  tcu::TestStatus::pass(__return_storage_ptr__,successMessage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageClearingTestInstance::verifyResultImage (const std::string& successMessage, const UVec4& clearCoords) const
{
	const bool useClearRange = clearCoords != UVec4();
	DE_ASSERT(!useClearRange || m_params.imageExtent.depth == 1u);

	if (getIsDepthFormat(m_params.imageFormat))
	{
		DE_ASSERT(m_imageMipLevels == 1u);

		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_DEPTH_BIT);
		std::string							message;
		float								depthValue;

		for (deUint32 y = 0; y < m_params.imageExtent.height; ++y)
		for (deUint32 x = 0; x < m_params.imageExtent.width; ++x)
		{
			if (!useClearRange || isInClearRange(clearCoords, x, y))
				depthValue = m_params.clearValue[0].depthStencil.depth;
			else
				depthValue = m_params.initValue.depthStencil.depth;

			if (!comparePixelToDepthClearValue(image->getLevel(0), x, y, depthValue, message))
				return TestStatus::fail("Depth value mismatch! " + message);
		}
	}

	if (getIsStencilFormat(m_params.imageFormat))
	{
		DE_ASSERT(m_imageMipLevels == 1u);

		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_STENCIL_BIT);
		std::string							message;
		deUint32							stencilValue;

		for (deUint32 y = 0; y < m_params.imageExtent.height; ++y)
		for (deUint32 x = 0; x < m_params.imageExtent.width; ++x)
		{
			if (!useClearRange || isInClearRange(clearCoords, x, y))
				stencilValue = m_params.clearValue[0].depthStencil.stencil;
			else
				stencilValue = m_params.initValue.depthStencil.stencil;

			if (!comparePixelToStencilClearValue(image->getLevel(0), x, y, stencilValue, message))
				return TestStatus::fail("Stencil value mismatch! " + message);
		}
	}

	if (!isDepthStencilFormat(m_params.imageFormat))
	{
		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_COLOR_BIT);
		std::string							message;
		const VkClearColorValue*			pColorValue;

		for (deUint32 mipLevel = 0; mipLevel < m_imageMipLevels; ++mipLevel)
		{
			const int			clearColorNdx	= (mipLevel < m_thresholdMipLevel ? 0 : 1);
			const VkExtent3D	extent			= getMipLevelExtent(m_params.imageExtent, mipLevel);

			for (deUint32 z = 0; z < extent.depth;  ++z)
			for (deUint32 y = 0; y < extent.height; ++y)
			for (deUint32 x = 0; x < extent.width;  ++x)
			{
				if (!useClearRange || isInClearRange(clearCoords, x, y))
					pColorValue = &m_params.clearValue[clearColorNdx].color;
				else
					pColorValue = &m_params.initValue.color;

				if (!comparePixelToColorClearValue(image->getLevel(mipLevel), x, y, z, *pColorValue, message))
					return TestStatus::fail("Color value mismatch! " + message);
			}
		}
	}

	return TestStatus::pass(successMessage);
}